

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SugarConvDsk_EDsk_HFE_Test::TestBody(SugarConvDsk_EDsk_HFE_Test *this)

{
  bool bVar1;
  char *in_file_00;
  char *out_file_00;
  Message *message;
  AssertHelper local_258;
  Message local_250;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  string error_string;
  path local_1a8;
  undefined1 local_168 [8];
  path out_path;
  string out_file;
  path local_c8;
  undefined1 local_88 [8];
  path in_file;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string filename_to_test;
  SugarConvDsk_EDsk_HFE_Test *this_local;
  
  filename_to_test.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"Barbarian (1987)(Palace Software)(Disk 1 of 2)[a].dsk",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_c8,&dump_dir_abi_cxx11_);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)((long)&out_file.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::experimental::filesystem::v1::__cxx11::operator/
            ((path *)local_88,&local_c8,(path *)((long)&out_file.field_2 + 8));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)((long)&out_file.field_2 + 8));
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &out_path._M_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 ".HFE");
  std::experimental::filesystem::v1::__cxx11::path::path(&local_1a8,&out_dir_abi_cxx11_);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)((long)&error_string.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_path._M_type)
  ;
  std::experimental::filesystem::v1::__cxx11::operator/
            ((path *)local_168,&local_1a8,(path *)((long)&error_string.field_2 + 8));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)((long)&error_string.field_2 + 8))
  ;
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_1a8);
  std::__cxx11::string::string((string *)local_208);
  std::experimental::filesystem::v1::__cxx11::path::string(&local_228,(path *)local_88);
  in_file_00 = (char *)std::__cxx11::string::c_str();
  std::experimental::filesystem::v1::__cxx11::path::string(&local_248,(path *)local_168);
  out_file_00 = (char *)std::__cxx11::string::c_str();
  bVar1 = CompareConversion(in_file_00,out_file_00,"-o=HFE",(string *)local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    testing::Message::Message(&local_250);
    message = testing::Message::operator<<
                        (&local_250,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Tom1975[P]SugarConvDsk/Tests/test.cpp"
               ,0xdd,"Failed");
    testing::internal::AssertHelper::operator=(&local_258,message);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message(&local_250);
  }
  std::__cxx11::string::~string((string *)local_208);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_168);
  std::__cxx11::string::~string((string *)&out_path._M_type);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_88);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(SugarConvDsk, EDsk_HFE)
{
	const std::string filename_to_test = "Barbarian (1987)(Palace Software)(Disk 1 of 2)[a].dsk";
	const fs::path in_file = fs::path(dump_dir) / filename_to_test;
	std::string out_file = filename_to_test + ".HFE";
	const fs::path out_path = fs::path(out_dir) / out_file;

	std::string error_string;
	if (!CompareConversion(in_file.string().c_str(), out_path.string().c_str(), "-o=HFE", error_string))
	{
		FAIL() << error_string;
	}
}